

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::ChainPromiseNode::traceEvent(ChainPromiseNode *this,TraceBuilder *builder)

{
  bool bVar1;
  PromiseNode *pPVar2;
  TraceBuilder *builder_local;
  ChainPromiseNode *this_local;
  
  if (this->state == STEP1) {
    pPVar2 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::get(&this->inner);
    if (pPVar2 != (PromiseNode *)0x0) {
      pPVar2 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&this->inner);
      (*(pPVar2->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])(pPVar2,builder,1);
    }
    bVar1 = TraceBuilder::full(builder);
    if ((!bVar1) && (this->onReadyEvent != (Event *)0x0)) {
      (**this->onReadyEvent->_vptr_Event)(this->onReadyEvent,builder);
    }
  }
  return;
}

Assistant:

void ChainPromiseNode::traceEvent(TraceBuilder& builder) {
  switch (state) {
    case STEP1:
      if (inner.get() != nullptr) {
        inner->tracePromise(builder, true);
      }
      if (!builder.full() && onReadyEvent != nullptr) {
        onReadyEvent->traceEvent(builder);
      }
      break;
    case STEP2:
      // This probably never happens -- a trace being generated after the meat of fire() already
      // executed. If it does, though, we probably can't do anything here. We don't know if
      // `onReadyEvent` is still valid because we passed it on to the phase-2 promise, and tracing
      // just `inner` would probably be confusing. Let's just do nothing.
      break;
  }
}